

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BVHLoader.cpp
# Opt level: O0

void __thiscall Assimp::BVHLoader::ReadStructure(BVHLoader *this,aiScene *pScene)

{
  bool bVar1;
  allocator<char> local_b1;
  string local_b0;
  undefined1 local_90 [8];
  string motion;
  string local_68;
  undefined1 local_38 [8];
  string header;
  aiScene *pScene_local;
  BVHLoader *this_local;
  
  header.field_2._8_8_ = pScene;
  GetNextToken_abi_cxx11_((string *)local_38,this);
  bVar1 = std::operator!=((string *)local_38,"HIERARCHY");
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_68,"Expected header string \"HIERARCHY\".",
               (allocator<char> *)(motion.field_2._M_local_buf + 0xf));
    ThrowException(this,&local_68);
  }
  ReadHierarchy(this,(aiScene *)header.field_2._8_8_);
  GetNextToken_abi_cxx11_((string *)local_90,this);
  bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_90,"MOTION");
  if (!bVar1) {
    ReadMotion(this,(aiScene *)header.field_2._8_8_);
    std::__cxx11::string::~string((string *)local_90);
    std::__cxx11::string::~string((string *)local_38);
    return;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b0,"Expected beginning of motion data \"MOTION\".",&local_b1);
  ThrowException(this,&local_b0);
}

Assistant:

void BVHLoader::ReadStructure( aiScene* pScene)
{
    // first comes hierarchy
    std::string header = GetNextToken();
    if( header != "HIERARCHY")
        ThrowException( "Expected header string \"HIERARCHY\".");
    ReadHierarchy( pScene);

    // then comes the motion data
    std::string motion = GetNextToken();
    if( motion != "MOTION")
        ThrowException( "Expected beginning of motion data \"MOTION\".");
    ReadMotion( pScene);
}